

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O3

int mriStep_CheckCoupling(ARKodeMem ark_mem)

{
  uint uVar1;
  void *pvVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  sunrealtype ***pppsVar6;
  sunrealtype ***pppsVar7;
  int iVar8;
  int error_code;
  MRIStepCoupling MRIC;
  long lVar9;
  char *msgfmt;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  double dVar15;
  
  pvVar2 = ark_mem->step_mem;
  if (pvVar2 == (void *)0x0) {
    msgfmt = "Time step module memory is NULL.";
    iVar4 = -0x15;
    error_code = -0x15;
    iVar8 = 0x72d;
    goto LAB_001467e0;
  }
  MRIC = *(MRIStepCoupling *)((long)pvVar2 + 0x38);
  uVar1 = MRIC->stages;
  uVar5 = (ulong)(int)uVar1;
  if ((long)uVar5 < 1) {
    msgfmt = "stages < 1!";
    iVar4 = -0x29;
    error_code = -0x29;
    iVar8 = 0x736;
    goto LAB_001467e0;
  }
  if (MRIC->q < 1) {
    msgfmt = "method order < 1";
    iVar4 = -0x29;
    error_code = -0x29;
    iVar8 = 0x73e;
    goto LAB_001467e0;
  }
  if ((MRIC->p < 1) && (ark_mem->fixedstep == 0)) {
    msgfmt = "embedding order < 1";
    iVar4 = -0x29;
    error_code = -0x29;
    iVar8 = 0x746;
    goto LAB_001467e0;
  }
  if (*(int *)((long)pvVar2 + 0x1c) == 0) {
    if (*(int *)((long)pvVar2 + 0x18) == 0) goto LAB_0014648c;
    pppsVar7 = MRIC->W;
    if ((pppsVar7 == (sunrealtype ***)0x0) || (MRIC->G != (sunrealtype ***)0x0)) {
      msgfmt = "Invalid coupling table for an explicit problem!";
      iVar4 = -0x16;
      error_code = -0x16;
      iVar8 = 0x75b;
      goto LAB_001467e0;
    }
    pppsVar6 = (sunrealtype ***)0x0;
LAB_001464fc:
    if (0 < (long)MRIC->nmat) {
      dVar15 = 0.0;
      lVar9 = 0;
      do {
        uVar10 = 0;
        do {
          uVar14 = uVar10;
          do {
            dVar15 = dVar15 + ABS(pppsVar7[lVar9][uVar10][uVar14]);
            uVar14 = uVar14 + 1;
          } while (uVar14 < uVar5);
          uVar10 = uVar10 + 1;
        } while (uVar10 != uVar5);
        lVar9 = lVar9 + 1;
      } while (lVar9 != MRIC->nmat);
      if (2.220446049250313e-14 < dVar15) {
        msgfmt = "Coupling can be up to ERK (at most)!";
        iVar4 = -0x29;
        error_code = -0x29;
        iVar8 = 0x77b;
        goto LAB_001467e0;
      }
    }
    if (pppsVar6 != (sunrealtype ***)0x0) goto LAB_00146586;
  }
  else {
    if (*(int *)((long)pvVar2 + 0x18) != 0) {
      pppsVar7 = MRIC->W;
      if ((pppsVar7 == (sunrealtype ***)0x0) ||
         (pppsVar6 = MRIC->G, pppsVar6 == (sunrealtype ***)0x0)) {
        msgfmt = "Invalid coupling table for an IMEX problem!";
        iVar4 = -0x16;
        error_code = -0x16;
        iVar8 = 0x751;
        goto LAB_001467e0;
      }
      goto LAB_001464fc;
    }
LAB_0014648c:
    if ((MRIC->W != (sunrealtype ***)0x0) || (pppsVar6 = MRIC->G, pppsVar6 == (sunrealtype ***)0x0))
    {
      msgfmt = "Invalid coupling table fro an implicit problem!";
      iVar4 = -0x16;
      error_code = -0x16;
      iVar8 = 0x765;
      goto LAB_001467e0;
    }
LAB_00146586:
    if (0 < (long)MRIC->nmat) {
      dVar15 = 0.0;
      lVar9 = 0;
      do {
        lVar11 = 0;
        uVar10 = (ulong)uVar1;
        uVar14 = 0;
        do {
          uVar12 = uVar14 + 1;
          if (uVar12 < uVar5) {
            uVar13 = 1;
            do {
              dVar15 = dVar15 + ABS(*(double *)((long)pppsVar6[lVar9][uVar14] + uVar13 * 8 + lVar11)
                                   );
              uVar13 = uVar13 + 1;
            } while (uVar10 != uVar13);
          }
          lVar11 = lVar11 + 8;
          uVar10 = uVar10 - 1;
          uVar14 = uVar12;
        } while (uVar12 != uVar1);
        lVar9 = lVar9 + 1;
      } while (lVar9 != MRIC->nmat);
      if (2.220446049250313e-14 < dVar15) {
        msgfmt = "Coupling can be up to DIRK (at most)!";
        iVar4 = -0x29;
        error_code = -0x29;
        iVar8 = 0x791;
        goto LAB_001467e0;
      }
    }
  }
  bVar3 = true;
  iVar8 = 0;
  do {
    iVar4 = mriStepCoupling_GetStageType(MRIC,iVar8);
    if (iVar4 == 3) {
      bVar3 = false;
    }
    iVar8 = iVar8 + 1;
    MRIC = *(MRIStepCoupling *)((long)pvVar2 + 0x38);
    uVar1 = MRIC->stages;
  } while (iVar8 < (int)uVar1);
  if (bVar3) {
    if (1 < (int)uVar1) {
      bVar3 = true;
      uVar5 = 1;
      do {
        if (MRIC->c[uVar5] - MRIC->c[uVar5 - 1] < -2.220446049250313e-14) {
          bVar3 = false;
        }
        uVar5 = uVar5 + 1;
      } while (uVar1 != uVar5);
      if (!bVar3) {
        msgfmt = "Stage times must be sorted.";
        iVar4 = -0x29;
        error_code = -0x29;
        iVar8 = 0x7b2;
        goto LAB_001467e0;
      }
    }
    dVar15 = ABS(*MRIC->c);
    if (0 < (long)MRIC->nmat) {
      lVar9 = 0;
      do {
        if (0 < (int)uVar1) {
          uVar5 = 0;
          do {
            if (MRIC->W != (sunrealtype ***)0x0) {
              dVar15 = dVar15 + ABS((*MRIC->W[lVar9])[uVar5]);
            }
            if (MRIC->G != (sunrealtype ***)0x0) {
              dVar15 = dVar15 + ABS((*MRIC->G[lVar9])[uVar5]);
            }
            uVar5 = uVar5 + 1;
          } while (uVar1 != uVar5);
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 != MRIC->nmat);
    }
    if (dVar15 <= 2.220446049250313e-14) {
      if (ABS(1.0 - MRIC->c[(long)(int)uVar1 + -1]) <= 2.220446049250313e-14) {
        return 0;
      }
      msgfmt = "Final stage time must be equal 1.";
      iVar4 = -0x29;
      error_code = -0x29;
      iVar8 = 0x7cb;
    }
    else {
      msgfmt = "First stage must equal old solution.";
      iVar4 = -0x29;
      error_code = -0x29;
      iVar8 = 0x7c3;
    }
  }
  else {
    msgfmt = "solve-coupled DIRK stages not currently supported";
    iVar4 = -0x29;
    error_code = -0x29;
    iVar8 = 0x7a2;
  }
LAB_001467e0:
  arkProcessError(ark_mem,error_code,iVar8,"mriStep_CheckCoupling",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_mristep.c"
                  ,msgfmt);
  return iVar4;
}

Assistant:

int mriStep_CheckCoupling(ARKodeMem ark_mem)
{
  int i, j, k;
  sunbooleantype okay;
  ARKodeMRIStepMem step_mem;
  sunrealtype Gabs, Wabs;
  const sunrealtype tol = SUN_RCONST(100.0) * SUN_UNIT_ROUNDOFF;

  /* access ARKodeMRIStepMem structure */
  if (ark_mem->step_mem == NULL)
  {
    arkProcessError(ark_mem, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_MRISTEP_NO_MEM);
    return (ARK_MEM_NULL);
  }
  step_mem = (ARKodeMRIStepMem)ark_mem->step_mem;

  /* check that stages > 0 */
  if (step_mem->MRIC->stages < 1)
  {
    arkProcessError(ark_mem, ARK_INVALID_TABLE, __LINE__, __func__, __FILE__,
                    "stages < 1!");
    return (ARK_INVALID_TABLE);
  }

  /* check that method order q > 0 */
  if (step_mem->MRIC->q < 1)
  {
    arkProcessError(ark_mem, ARK_INVALID_TABLE, __LINE__, __func__, __FILE__,
                    "method order < 1");
    return (ARK_INVALID_TABLE);
  }

  /* check that embedding order p > 0 (if adaptive) */
  if ((step_mem->MRIC->p < 1) && (!ark_mem->fixedstep))
  {
    arkProcessError(ark_mem, ARK_INVALID_TABLE, __LINE__, __func__, __FILE__,
                    "embedding order < 1");
    return (ARK_INVALID_TABLE);
  }

  /* Check that the matrices are defined appropriately */
  if (step_mem->implicit_rhs && step_mem->explicit_rhs)
  {
    /* ImEx */
    if (!(step_mem->MRIC->W) || !(step_mem->MRIC->G))
    {
      arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                      "Invalid coupling table for an IMEX problem!");
      return (ARK_ILL_INPUT);
    }
  }
  else if (step_mem->explicit_rhs)
  {
    /* Explicit */
    if (!(step_mem->MRIC->W) || step_mem->MRIC->G)
    {
      arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                      "Invalid coupling table for an explicit problem!");
      return (ARK_ILL_INPUT);
    }
  }
  else
  {
    /* Implicit */
    if (step_mem->MRIC->W || !(step_mem->MRIC->G))
    {
      arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                      "Invalid coupling table fro an implicit problem!");
      return (ARK_ILL_INPUT);
    }
  }

  /* Check that W tables are strictly lower triangular */
  if (step_mem->MRIC->W)
  {
    Wabs = SUN_RCONST(0.0);
    for (k = 0; k < step_mem->MRIC->nmat; k++)
    {
      for (i = 0; i < step_mem->MRIC->stages; i++)
      {
        for (j = i; j < step_mem->MRIC->stages; j++)
        {
          Wabs += SUNRabs(step_mem->MRIC->W[k][i][j]);
        }
      }
    }
    if (Wabs > tol)
    {
      arkProcessError(ark_mem, ARK_INVALID_TABLE, __LINE__, __func__, __FILE__,
                      "Coupling can be up to ERK (at most)!");
      return (ARK_INVALID_TABLE);
    }
  }

  /* Check that G tables are lower triangular */
  if (step_mem->MRIC->G)
  {
    Gabs = SUN_RCONST(0.0);
    for (k = 0; k < step_mem->MRIC->nmat; k++)
    {
      for (i = 0; i < step_mem->MRIC->stages; i++)
      {
        for (j = i + 1; j < step_mem->MRIC->stages; j++)
        {
          Gabs += SUNRabs(step_mem->MRIC->G[k][i][j]);
        }
      }
    }
    if (Gabs > tol)
    {
      arkProcessError(ark_mem, ARK_INVALID_TABLE, __LINE__, __func__, __FILE__,
                      "Coupling can be up to DIRK (at most)!");
      return (ARK_INVALID_TABLE);
    }
  }

  /* Check that no stage has MRISTAGE_DIRK_FAST type (for now) */
  okay = SUNTRUE;
  for (i = 0; i < step_mem->MRIC->stages; i++)
  {
    if (mriStepCoupling_GetStageType(step_mem->MRIC, i) == MRISTAGE_DIRK_FAST)
    {
      okay = SUNFALSE;
    }
  }
  if (!okay)
  {
    arkProcessError(ark_mem, ARK_INVALID_TABLE, __LINE__, __func__, __FILE__,
                    "solve-coupled DIRK stages not currently supported");
    return (ARK_INVALID_TABLE);
  }

  /* check that stage times are sorted */
  okay = SUNTRUE;
  for (i = 1; i < step_mem->MRIC->stages; i++)
  {
    if ((step_mem->MRIC->c[i] - step_mem->MRIC->c[i - 1]) < -tol)
    {
      okay = SUNFALSE;
    }
  }
  if (!okay)
  {
    arkProcessError(ark_mem, ARK_INVALID_TABLE, __LINE__, __func__, __FILE__,
                    "Stage times must be sorted.");
    return (ARK_INVALID_TABLE);
  }

  /* check that the first stage is just the old step solution */
  Gabs = SUNRabs(step_mem->MRIC->c[0]);
  for (k = 0; k < step_mem->MRIC->nmat; k++)
  {
    for (j = 0; j < step_mem->MRIC->stages; j++)
    {
      if (step_mem->MRIC->W) { Gabs += SUNRabs(step_mem->MRIC->W[k][0][j]); }
      if (step_mem->MRIC->G) { Gabs += SUNRabs(step_mem->MRIC->G[k][0][j]); }
    }
  }
  if (Gabs > tol)
  {
    arkProcessError(ark_mem, ARK_INVALID_TABLE, __LINE__, __func__, __FILE__,
                    "First stage must equal old solution.");
    return (ARK_INVALID_TABLE);
  }

  /* check that the last stage is at the final time */
  if (SUNRabs(ONE - step_mem->MRIC->c[step_mem->MRIC->stages - 1]) > tol)
  {
    arkProcessError(ark_mem, ARK_INVALID_TABLE, __LINE__, __func__, __FILE__,
                    "Final stage time must be equal 1.");
    return (ARK_INVALID_TABLE);
  }

  return (ARK_SUCCESS);
}